

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millisleep.c
# Opt level: O3

int millisecond_sleep(long milliseconds)

{
  int iVar1;
  int *piVar2;
  timespec sleep_time;
  timespec local_20;
  
  if (milliseconds < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    local_20.tv_sec = (ulong)milliseconds / 1000;
    local_20.tv_nsec = ((ulong)milliseconds % 1000) * 1000000;
    do {
      iVar1 = nanosleep(&local_20,&local_20);
      if (iVar1 == 0) {
        return 0;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return iVar1;
}

Assistant:

int millisecond_sleep(long milliseconds)
{
    struct timespec sleep_time;
    int status;

    if (milliseconds < 0)
    {
        errno = EINVAL;
        return -1;
    }

    sleep_time.tv_sec = milliseconds / 1000;
    sleep_time.tv_nsec = (milliseconds % 1000) * 1000000;

    do
    {
        status = nanosleep(&sleep_time, &sleep_time);
    }
    while (status && errno == EINTR);

    return status;
}